

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

size_t flatcc_builder_enter_user_frame(flatcc_builder_t *B,size_t size)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  size_t *__s;
  
  uVar4 = size + 7 & 0xfffffffffffffff8;
  sVar2 = B->user_frame_end;
  uVar3 = sVar2 + uVar4 + 8;
  if (B->buffers[7].iov_len < uVar3) {
    iVar1 = (*B->alloc)(B->alloc_context,B->buffers + 7,uVar3,0,7);
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
    }
  }
  __s = (size_t *)(sVar2 + (long)B->buffers[7].iov_base);
  if (__s == (size_t *)0x0) {
    sVar2 = 0;
  }
  else {
    __n = uVar4 + 8;
    memset(__s,0,__n);
    *__s = B->user_frame_offset;
    sVar2 = B->user_frame_end + 8;
    B->user_frame_offset = sVar2;
    B->user_frame_end = __n + B->user_frame_end;
  }
  return sVar2;
}

Assistant:

size_t flatcc_builder_enter_user_frame(flatcc_builder_t *B, size_t size)
{
    size_t *frame;

    size = alignup_size(size, sizeof(size_t)) + sizeof(size_t);

    if (!(frame = reserve_buffer(B, flatcc_builder_alloc_us, B->user_frame_end, size, 0))) {
        return 0;
    }
    memset(frame, 0, size);
    *frame++ = B->user_frame_offset;
    B->user_frame_offset = B->user_frame_end + sizeof(size_t);
    B->user_frame_end += size;
    return B->user_frame_offset;
}